

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  float *pfVar9;
  Layer *pLVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  Option OVar23;
  Option OVar24;
  undefined1 auVar25 [36];
  int iVar26;
  undefined1 uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  Allocator *pAVar34;
  float fVar35;
  int iVar36;
  undefined4 *puVar37;
  int iVar38;
  undefined1 (*pauVar39) [16];
  uint _elempack;
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  iterator iVar45;
  long lVar46;
  uint uVar47;
  pointer pfVar48;
  Option *pOVar49;
  int iVar50;
  long lVar51;
  float *pfVar52;
  ulong uVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128 max;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  v4sf one;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  int local_2fc;
  float *local_2f8;
  long local_2e0;
  byte local_2c0;
  undefined1 local_2b8 [24];
  int iStack_2a0;
  Allocator *pAStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  int iStack_280;
  undefined1 auStack_29c [36];
  size_t local_278;
  ulong local_270;
  undefined1 local_268 [24];
  int iStack_250;
  Allocator *pAStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  int iStack_230;
  undefined1 auStack_24c [36];
  size_t local_228;
  ulong local_220;
  Mat local_218;
  ulong local_1d0;
  float local_1c4;
  pointer local_1c0;
  int *local_1b8;
  Allocator *local_1b0;
  int local_1a8;
  Allocator *local_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  ulong local_180;
  Mat local_178;
  size_type local_130;
  long local_128;
  void *local_120;
  int *local_118;
  Allocator *local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  
  local_178.c = bottom_blob->c;
  local_178.elempack = bottom_blob->elempack;
  local_178.elemsize = bottom_blob->elemsize;
  iVar31 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar42 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar36 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar4 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount = bottom_blob->refcount;
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178.h = bottom_blob->h;
  local_178.d = bottom_blob->d;
  local_178.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (local_178.elempack == 0 || ((int)local_178.elemsize * 8) / local_178.elempack != 8) {
    uVar53 = (long)(local_178.elempack * local_178.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_218.cstep = 0;
    local_218.data = (undefined4 *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
    Mat::create(&local_218,local_178.elempack * local_178.c,4,(Allocator *)0x0);
    lVar33 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar33) {
      pvVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar44 = 0;
      puVar37 = (undefined4 *)local_218.data;
      do {
        if (0 < (int)uVar53) {
          uVar3 = *(undefined4 *)((long)pvVar5 + lVar44 * 4);
          uVar41 = uVar53 & 0xffffffff;
          do {
            *puVar37 = uVar3;
            puVar37 = puVar37 + 1;
            uVar47 = (int)uVar41 - 1;
            uVar41 = (ulong)uVar47;
          } while (uVar47 != 0);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != lVar33);
    }
    auVar84 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar84 = vmovdqu64_avx512f(auVar84);
    stack0xfffffffffffffd58 = auVar84._16_48_;
    local_2b8._0_8_ = auVar84._0_8_;
    local_2b8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_178,&local_218,(Option *)local_2b8);
    bVar54 = local_178.data == (void *)0x0;
    lVar33 = (long)local_178.c * local_178.cstep;
    piVar4 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_218.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_218.data != (undefined4 *)0x0) {
            free(local_218.data);
          }
        }
        else {
          (*(local_218.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_2fc = -100;
    if (bVar54 || lVar33 == 0) goto LAB_003e63ed;
  }
  local_218.cstep = 0;
  local_218.data = (undefined4 *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_178,&local_218,opt);
  iVar32 = local_218.c;
  iVar26 = local_218.w;
  iVar43 = local_218.elempack;
  if (((undefined4 *)local_218.data == (undefined4 *)0x0) ||
     (lVar33 = (long)local_218.c, local_218.cstep * lVar33 == 0)) {
    local_2fc = -100;
  }
  else {
    iVar31 = (~((iVar31 + -1) * iVar42) + local_218.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar42 = iVar31 + 1;
    uVar53 = (long)(~((iVar50 + -1) * iVar36) + local_218.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_220 = uVar53 & 0xffffffff;
    iVar50 = (int)uVar53 + 1;
    uVar47 = local_218.elempack * local_218.c;
    if ((uVar47 == (this->super_ConvolutionDepthWise).group) &&
       (uVar47 == (this->super_ConvolutionDepthWise).num_output)) {
      local_2fc = -100;
      uVar30 = 8;
      if (opt->use_packing_layout == false) {
        uVar30 = 1;
      }
      if ((uVar47 & 7) != 0) {
        uVar30 = 1;
      }
      iVar36 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar13 = uVar30 * 4;
      if (100 < iVar36) {
        uVar13 = uVar30;
      }
      Mat::create(top_blob,iVar42,iVar50,(int)uVar47 / (int)uVar30,(ulong)uVar13,uVar30,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        if (iVar43 == 1) {
          iVar50 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
          iVar43 = (this->super_ConvolutionDepthWise).stride_w;
          iVar32 = (this->super_ConvolutionDepthWise).stride_h;
          iVar28 = (this->super_ConvolutionDepthWise).dilation_w;
          iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
          uVar47 = (this->super_ConvolutionDepthWise).activation_type;
          pOVar49 = (Option *)(ulong)uVar47;
          if ((1 < uVar47 || (iVar29 != 1 || iVar28 != 1)) ||
              ((iVar32 != 1 || iVar43 != 1) || (iVar42 != 3 || iVar50 != 3))) {
            pOVar49 = (Option *)(ulong)CONCAT31((int3)(uVar47 >> 8),uVar47 < 2);
            if (((iVar32 != 2 || iVar43 != 2) || uVar47 >= 2) ||
                ((iVar42 != 3 || iVar50 != 3) || (iVar28 != 1 || iVar29 != 1))) {
              local_2fc = 0;
              uVar47 = iVar42 * iVar50;
              local_130 = (size_type)(int)uVar47;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_2b8,local_130,
                         (allocator_type *)local_268);
              uVar22 = local_2b8._0_8_;
              iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar50) {
                iVar42 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar43 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar32 = (this->super_ConvolutionDepthWise).dilation_w * iVar43;
                iVar28 = 0;
                fVar35 = 0.0;
                iVar29 = 0;
                do {
                  if (0 < iVar43) {
                    lVar33 = 0;
                    do {
                      *(float *)(local_2b8._0_8_ + (iVar29 + lVar33) * 4) = fVar35;
                      fVar35 = (float)((int)fVar35 + (this->super_ConvolutionDepthWise).dilation_w);
                      iVar43 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar33 = lVar33 + 1;
                    } while ((int)lVar33 < iVar43);
                    iVar29 = iVar29 + (int)lVar33;
                    iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  fVar35 = (float)((int)fVar35 + (iVar26 * iVar42 - iVar32));
                  iVar28 = iVar28 + 1;
                } while (iVar28 < iVar50);
              }
              iVar50 = (this->super_ConvolutionDepthWise).group;
              pfVar48 = (pointer)local_2b8._0_8_;
              if (0 < iVar50) {
                lVar33 = 0;
                auVar84 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                lVar44 = 0;
                do {
                  pvVar5 = local_218.data;
                  if (-1 < (int)local_220) {
                    lVar51 = local_218.cstep * lVar44 * local_218.elemsize;
                    pfVar52 = (float *)(top_blob->elemsize * lVar44 * top_blob->cstep +
                                       (long)top_blob->data);
                    lVar46 = (long)local_218.w * local_218.elemsize;
                    pvVar6 = (this->weight_data_tm).data;
                    local_1d0 = 0;
                    local_2f8 = pfVar52;
                    local_128 = lVar33;
                    do {
                      if (-1 < iVar31) {
                        local_270 = (ulong)(int)local_1d0;
                        iVar50 = 0;
                        do {
                          fVar35 = 0.0;
                          fVar85 = 0.0;
                          if (0 < (int)uVar47) {
                            uVar53 = 0;
                            iVar42 = 0;
                            do {
                              iVar42 = iVar42 + (int)*(char *)((long)pvVar6 + uVar53 + lVar33) *
                                                (int)*(char *)((long)pvVar5 +
                                                              (long)(int)*(pointer)(uVar22 + uVar53 
                                                  * 4) + (long)(this->super_ConvolutionDepthWise).
                                                               stride_h * local_270 * lVar46 +
                                                         (long)iVar50 *
                                                         (long)(this->super_ConvolutionDepthWise).
                                                               stride_w + lVar51);
                              uVar53 = uVar53 + 1;
                            } while (uVar47 != uVar53);
                            fVar85 = (float)iVar42;
                          }
                          fVar1 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar44 * 4);
                          if (fVar1 != 0.0) {
                            fVar35 = 1.0 / (fVar1 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar44 * 4));
                          }
                          fVar35 = fVar35 * fVar85;
                          if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                            fVar35 = fVar35 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bias_data.data + lVar44 * 4);
                          }
                          auVar55 = ZEXT416((uint)fVar35);
                          fVar85 = fVar35;
                          switch((this->super_ConvolutionDepthWise).activation_type) {
                          case 1:
                            auVar55 = vmaxss_avx(auVar55,ZEXT416(0));
                            fVar85 = auVar55._0_4_;
                            break;
                          case 2:
                            uVar12 = vcmpss_avx512f(auVar55,ZEXT416(0),0xe);
                            bVar54 = (bool)((byte)uVar12 & 1);
                            fVar85 = (float)((uint)bVar54 * 0x3f800000 +
                                            (uint)!bVar54 *
                                            *(this->super_ConvolutionDepthWise).activation_params.
                                             data) * fVar35;
                            break;
                          case 3:
                            puVar8 = (uint *)(this->super_ConvolutionDepthWise).activation_params.
                                             data;
                            fVar35 = (float)puVar8[1];
                            auVar55 = vmaxss_avx(auVar55,ZEXT416(*puVar8));
                            fVar85 = auVar55._0_4_;
                            if (fVar35 < auVar55._0_4_) {
                              fVar85 = fVar35;
                            }
                            break;
                          case 4:
                            auVar55 = vminss_avx(auVar55,SUB6416(ZEXT464(0x42b0c0a5),0));
                            uVar12 = vcmpss_avx512f(auVar55,ZEXT416(0xc2b0c0a5),1);
                            bVar54 = (bool)((byte)uVar12 & 1);
                            fVar35 = expf((float)((uint)bVar54 * 0x42b0c0a5 +
                                                 (uint)!bVar54 * (auVar55._0_4_ ^ auVar84._0_4_)));
                            auVar84 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            fVar85 = 1.0 / (fVar35 + 1.0);
                            break;
                          case 5:
                            local_1c4 = fVar35;
                            fVar35 = expf(fVar35);
                            fVar35 = logf(fVar35 + 1.0);
                            fVar35 = tanhf(fVar35);
                            auVar84 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            fVar85 = fVar35 * local_1c4;
                            break;
                          case 6:
                            pfVar9 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                              data;
                            fVar1 = *pfVar9;
                            fVar2 = pfVar9[1];
                            fVar87 = (float)((uint)fVar2 ^ auVar84._0_4_) / fVar1;
                            fVar85 = 0.0;
                            if ((fVar87 <= fVar35) &&
                               (fVar85 = fVar35, fVar35 <= fVar87 + 1.0 / fVar1)) {
                              auVar55 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar55,
                                                        ZEXT416((uint)fVar2));
                              fVar85 = auVar55._0_4_ * fVar35;
                            }
                          }
                          if (iVar36 < 0x65) {
                            *pfVar52 = fVar85;
                            pfVar52 = pfVar52 + 1;
                          }
                          else {
                            fVar85 = fVar85 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               top_blob_int8_scales.data +
                                                        lVar44 * 4);
                            auVar55._8_4_ = 0x3effffff;
                            auVar55._0_8_ = 0x3effffff3effffff;
                            auVar55._12_4_ = 0x3effffff;
                            auVar55 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)fVar85),
                                                          auVar84._0_16_,0xf8);
                            auVar55 = ZEXT416((uint)(fVar85 + auVar55._0_4_));
                            auVar55 = vroundss_avx(auVar55,auVar55,0xb);
                            iVar42 = (int)auVar55._0_4_;
                            if (iVar42 < -0x7e) {
                              iVar42 = -0x7f;
                            }
                            uVar27 = (undefined1)iVar42;
                            if (0x7e < iVar42) {
                              uVar27 = 0x7f;
                            }
                            *(undefined1 *)local_2f8 = uVar27;
                            local_2f8 = (float *)((long)local_2f8 + 1);
                          }
                          bVar54 = iVar50 != iVar31;
                          iVar50 = iVar50 + 1;
                        } while (bVar54);
                      }
                      iVar50 = (int)local_1d0;
                      local_1d0 = (ulong)(iVar50 + 1);
                    } while (iVar50 != (int)local_220);
                    iVar50 = (this->super_ConvolutionDepthWise).group;
                    lVar33 = local_128;
                  }
                  lVar44 = lVar44 + 1;
                  lVar33 = lVar33 + local_130;
                } while (lVar44 < iVar50);
                pfVar48 = (pointer)local_2b8._0_8_;
              }
              if (pfVar48 != (pointer)0x0) {
                uVar53 = local_2b8._16_8_ - (long)pfVar48;
                goto LAB_003e6362;
              }
              goto LAB_003e6371;
            }
            if (iVar36 < 0x65) {
              local_2b8 = ZEXT1624((undefined1  [16])0x0);
              iVar31 = (this->super_ConvolutionDepthWise).group;
              if (0 < iVar31) {
                lVar33 = 0;
                do {
                  fVar35 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar33 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar33 * 4));
                  local_268._0_4_ = fVar35;
                  if (local_2b8._8_8_ == local_2b8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2b8,
                               (iterator)local_2b8._8_8_,(float *)local_268);
                    iVar31 = (this->super_ConvolutionDepthWise).group;
                  }
                  else {
                    *(float *)local_2b8._8_8_ = fVar35;
                    local_2b8._8_8_ = (float *)(local_2b8._8_8_ + 4);
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < iVar31);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_d8,(vector<float,_std::allocator<float>_> *)local_2b8);
              convdw3x3s2_int8_dequant_sse
                        (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_d8,pOVar49)
              ;
            }
            else {
              local_2b8 = ZEXT1624((undefined1  [16])0x0);
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar33 = 0;
                do {
                  fVar35 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar33 * 4);
                  fVar85 = 0.0;
                  if (fVar35 != 0.0) {
                    fVar85 = 1.0 / (fVar35 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar33 * 4));
                  }
                  local_268._0_4_ = fVar85;
                  local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar33 * 4));
                  pAVar34 = (Allocator *)local_2b8._16_8_;
                  if (local_2b8._8_8_ == local_2b8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2b8,
                               (iterator)local_2b8._8_8_,(float *)local_268);
                    pAVar34 = (Allocator *)local_2b8._16_8_;
                    iVar45._M_current = (float *)local_2b8._8_8_;
                  }
                  else {
                    *(float *)local_2b8._8_8_ = fVar85;
                    iVar45._M_current = (float *)(local_2b8._8_8_ + 4);
                    local_2b8._8_8_ = iVar45._M_current;
                  }
                  if ((Allocator *)iVar45._M_current == pAVar34) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2b8,iVar45,
                               (float *)&local_1c0);
                  }
                  else {
                    *iVar45._M_current = local_1c0._0_4_;
                    local_2b8._8_8_ = iVar45._M_current + 1;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2b8);
              convdw3x3s2_int8_requant_sse
                        (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_c0,pOVar49)
              ;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
          }
          else if (iVar36 < 0x65) {
            local_2b8 = ZEXT1624((undefined1  [16])0x0);
            iVar31 = (this->super_ConvolutionDepthWise).group;
            if (0 < iVar31) {
              lVar33 = 0;
              do {
                fVar35 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar33 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar33 * 4));
                local_268._0_4_ = fVar35;
                if (local_2b8._8_8_ == local_2b8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2b8,
                             (iterator)local_2b8._8_8_,(float *)local_268);
                  iVar31 = (this->super_ConvolutionDepthWise).group;
                }
                else {
                  *(float *)local_2b8._8_8_ = fVar35;
                  local_2b8._8_8_ = (float *)(local_2b8._8_8_ + 4);
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < iVar31);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2b8);
            convdw3x3s1_int8_dequant_sse
                      (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_a8,pOVar49);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2b8 = ZEXT1624((undefined1  [16])0x0);
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar33 = 0;
              do {
                fVar35 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar33 * 4);
                fVar85 = 0.0;
                if (fVar35 != 0.0) {
                  fVar85 = 1.0 / (fVar35 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar33 * 4));
                }
                local_268._0_4_ = fVar85;
                local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar33 * 4));
                pAVar34 = (Allocator *)local_2b8._16_8_;
                if (local_2b8._8_8_ == local_2b8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2b8,
                             (iterator)local_2b8._8_8_,(float *)local_268);
                  pAVar34 = (Allocator *)local_2b8._16_8_;
                  iVar45._M_current = (float *)local_2b8._8_8_;
                }
                else {
                  *(float *)local_2b8._8_8_ = fVar85;
                  iVar45._M_current = (float *)(local_2b8._8_8_ + 4);
                  local_2b8._8_8_ = iVar45._M_current;
                }
                if ((Allocator *)iVar45._M_current == pAVar34) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2b8,iVar45,
                             (float *)&local_1c0);
                }
                else {
                  *iVar45._M_current = local_1c0._0_4_;
                  local_2b8._8_8_ = iVar45._M_current + 1;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2b8);
            convdw3x3s1_int8_requant_sse
                      (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_90,pOVar49);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          local_2fc = 0;
          if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
          }
          pLVar10 = this->activation;
          if (pLVar10 != (Layer *)0x0) {
            (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          }
        }
        else {
          local_2fc = 0;
          if (iVar43 == 8) {
            uVar53 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                     (long)(this->super_ConvolutionDepthWise).kernel_w;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_2b8,uVar53,
                       (allocator_type *)local_268);
            iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
            if (0 < iVar50) {
              iVar42 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar43 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar28 = (this->super_ConvolutionDepthWise).dilation_w * iVar43;
              iVar29 = 0;
              fVar35 = 0.0;
              iVar38 = 0;
              do {
                if (0 < iVar43) {
                  lVar44 = 0;
                  do {
                    *(float *)(local_2b8._0_8_ + (iVar29 + lVar44) * 4) = fVar35;
                    fVar35 = (float)((int)fVar35 + (this->super_ConvolutionDepthWise).dilation_w);
                    iVar43 = (this->super_ConvolutionDepthWise).kernel_w;
                    lVar44 = lVar44 + 1;
                  } while ((int)lVar44 < iVar43);
                  iVar29 = iVar29 + (int)lVar44;
                  iVar50 = (this->super_ConvolutionDepthWise).kernel_h;
                }
                fVar35 = (float)((int)fVar35 + (iVar26 * iVar42 - iVar28));
                iVar38 = iVar38 + 1;
              } while (iVar38 < iVar50);
            }
            if (0 < iVar32) {
              iVar50 = 0;
              auVar84 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
              auVar133 = ZEXT1664(auVar55);
              auVar55 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
              auVar56 = vpbroadcastw_avx512vl(ZEXT216(0xff81));
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
              auVar131 = ZEXT1664(auVar57);
              auVar117 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
              auVar118 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
              auVar86._8_4_ = 0x3f000000;
              auVar86._0_8_ = 0x3f0000003f000000;
              auVar86._12_4_ = 0x3f000000;
              auVar122._8_4_ = 0x3f800000;
              auVar122._0_8_ = 0x3f8000003f800000;
              auVar122._12_4_ = 0x3f800000;
              auVar123._8_4_ = 0x3f318000;
              auVar123._0_8_ = 0x3f3180003f318000;
              auVar123._12_4_ = 0x3f318000;
              auVar124._8_4_ = 0xb95e8083;
              auVar124._0_8_ = 0xb95e8083b95e8083;
              auVar124._12_4_ = 0xb95e8083;
              auVar125 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
              auVar132 = ZEXT1664(auVar57);
              auVar128 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
              auVar129 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
              auVar130 = ZEXT1664(auVar57);
              auVar57 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
              local_2e0 = 0;
              do {
                if (-1 < (int)local_220) {
                  pauVar39 = (undefined1 (*) [16])
                             (top_blob->elemsize * local_2e0 * top_blob->cstep +
                             (long)top_blob->data);
                  pvVar5 = (this->weight_data_tm).data;
                  pauVar40 = pauVar39;
                  uVar41 = 0;
                  do {
                    local_270 = uVar41;
                    iVar42 = (int)local_270;
                    if (-1 < iVar31) {
                      iVar43 = 0;
                      do {
                        if ((int)uVar53 < 1) {
                          auVar58 = ZEXT816(0) << 0x40;
                          auVar59 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                        }
                        else {
                          auVar127 = ZEXT1664((undefined1  [16])0x0);
                          uVar41 = 0;
                          auVar58 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                          do {
                            auVar63._8_8_ = 0;
                            auVar63._0_8_ =
                                 *(ulong *)((long)local_218.data +
                                           (long)(int)*(pointer)(local_2b8._0_8_ + uVar41 * 4) * 8 +
                                           (long)(this->super_ConvolutionDepthWise).stride_h *
                                           (long)iVar42 * (long)local_218.w * local_218.elemsize +
                                           (long)((this->super_ConvolutionDepthWise).stride_w *
                                                  iVar43 * 8) +
                                           local_218.cstep * local_2e0 * local_218.elemsize);
                            auVar59 = vpcmpgtb_avx((undefined1  [16])0x0,auVar63);
                            auVar63 = vpunpcklbw_avx(auVar63,auVar59);
                            auVar83._8_8_ = 0;
                            auVar83._0_8_ = *(ulong *)((long)pvVar5 + uVar41 * 8 + (long)iVar50);
                            auVar59 = vpcmpgtb_avx((undefined1  [16])0x0,auVar83);
                            auVar59 = vpunpcklbw_avx(auVar83,auVar59);
                            auVar83 = vpmullw_avx(auVar59,auVar63);
                            auVar63 = vpmulhw_avx(auVar63,auVar59);
                            auVar59 = vpunpcklwd_avx(auVar83,auVar63);
                            auVar59 = vpaddd_avx(auVar127._0_16_,auVar59);
                            auVar127 = ZEXT1664(auVar59);
                            auVar63 = vpunpckhwd_avx(auVar83,auVar63);
                            auVar58 = vpaddd_avx512vl(auVar58,auVar63);
                            uVar41 = uVar41 + 1;
                          } while ((uVar53 & 0xffffffff) != uVar41);
                          auVar59 = vcvtdq2ps_avx512vl(auVar59);
                          auVar58 = vcvtdq2ps_avx512vl(auVar58);
                        }
                        pvVar6 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                        pvVar7 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                        auVar63 = *(undefined1 (*) [16])((long)pvVar6 + local_2e0 * 0x20);
                        auVar83 = *(undefined1 (*) [16])((long)pvVar6 + local_2e0 * 0x20 + 0x10);
                        auVar60 = vmulps_avx512vl(auVar63,*(undefined1 (*) [16])
                                                           ((long)pvVar7 + local_2e0 * 0x20));
                        auVar60 = vrcpps_avx(auVar60);
                        auVar61 = vmulps_avx512vl(auVar83,*(undefined1 (*) [16])
                                                           ((long)pvVar7 + local_2e0 * 0x20 + 0x10))
                        ;
                        auVar61 = vrcpps_avx(auVar61);
                        uVar41 = vcmpps_avx512vl(auVar63,(undefined1  [16])0x0,4);
                        uVar11 = vcmpps_avx512vl(auVar83,(undefined1  [16])0x0,4);
                        auVar62._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar60._4_4_;
                        auVar62._0_4_ = (uint)((byte)uVar41 & 1) * auVar60._0_4_;
                        auVar62._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar60._8_4_;
                        auVar62._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar60._12_4_;
                        auVar63 = vmulps_avx512vl(auVar62,auVar59);
                        auVar59._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar61._4_4_;
                        auVar59._0_4_ = (uint)((byte)uVar11 & 1) * auVar61._0_4_;
                        auVar59._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar61._8_4_;
                        auVar59._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar61._12_4_;
                        auVar58 = vmulps_avx512vl(auVar59,auVar58);
                        if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                          pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
                          auVar63 = vaddps_avx512vl(auVar63,*(undefined1 (*) [16])
                                                             ((long)pvVar6 + local_2e0 * 0x20));
                          auVar58 = vaddps_avx512vl(auVar58,*(undefined1 (*) [16])
                                                             ((long)pvVar6 + local_2e0 * 0x20 + 0x10
                                                             ));
                        }
                        in_ZMM22 = ZEXT1664(auVar58);
                        in_ZMM21 = ZEXT1664(auVar63);
                        auVar80 = auVar131._0_16_;
                        auVar126 = auVar132._0_16_;
                        auVar104 = auVar130._0_16_;
                        auVar91 = auVar129._0_16_;
                        auVar62 = auVar128._0_16_;
                        auVar60 = auVar118._0_16_;
                        auVar61 = auVar125._0_16_;
                        auVar83 = auVar117._0_16_;
                        auVar59 = auVar84._0_16_;
                        switch((this->super_ConvolutionDepthWise).activation_type) {
                        case 1:
                          auVar59 = vmaxps_avx512vl(auVar63,(undefined1  [16])0x0);
                          in_ZMM21 = ZEXT1664(auVar59);
                          auVar58 = vmaxps_avx512vl(auVar58,(undefined1  [16])0x0);
                          in_ZMM22 = ZEXT1664(auVar58);
                          break;
                        case 2:
                          auVar59 = vmaxps_avx512vl(auVar63,(undefined1  [16])0x0);
                          auVar63 = vminps_avx512vl(auVar63,(undefined1  [16])0x0);
                          uVar3 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar109._4_4_ = uVar3;
                          auVar109._0_4_ = uVar3;
                          auVar109._8_4_ = uVar3;
                          auVar109._12_4_ = uVar3;
                          auVar59 = vfmadd213ps_avx512vl(auVar63,auVar109,auVar59);
                          in_ZMM21 = ZEXT1664(auVar59);
                          auVar59 = vmaxps_avx512vl(auVar58,(undefined1  [16])0x0);
                          auVar58 = vminps_avx512vl(auVar58,(undefined1  [16])0x0);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar109,auVar59);
                          in_ZMM22 = ZEXT1664(auVar58);
                          break;
                        case 3:
                          puVar37 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar3 = *puVar37;
                          auVar92._4_4_ = uVar3;
                          auVar92._0_4_ = uVar3;
                          auVar92._8_4_ = uVar3;
                          auVar92._12_4_ = uVar3;
                          uVar3 = puVar37[1];
                          auVar105._4_4_ = uVar3;
                          auVar105._0_4_ = uVar3;
                          auVar105._8_4_ = uVar3;
                          auVar105._12_4_ = uVar3;
                          auVar59 = vmaxps_avx512vl(auVar63,auVar92);
                          auVar59 = vminps_avx512vl(auVar59,auVar105);
                          in_ZMM21 = ZEXT1664(auVar59);
                          auVar58 = vmaxps_avx512vl(auVar58,auVar92);
                          auVar58 = vminps_avx512vl(auVar58,auVar105);
                          in_ZMM22 = ZEXT1664(auVar58);
                          break;
                        case 4:
                          auVar63 = vxorps_avx512vl(auVar63,auVar59);
                          auVar63 = vminps_avx512vl(auVar63,auVar80);
                          auVar64 = vmaxps_avx(auVar63,auVar83);
                          auVar66 = vfmadd213ps_fma(auVar60,auVar64,auVar86);
                          auVar115._0_4_ = (int)auVar66._0_4_;
                          auVar115._4_4_ = (int)auVar66._4_4_;
                          auVar115._8_4_ = (int)auVar66._8_4_;
                          auVar115._12_4_ = (int)auVar66._12_4_;
                          auVar63 = vcvtdq2ps_avx(auVar115);
                          uVar41 = vcmpps_avx512vl(auVar66,auVar63,1);
                          auVar66 = vsubps_avx512vl(auVar63,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar81._0_4_ =
                               (float)((uint)bVar54 * auVar66._0_4_ | (uint)!bVar54 * auVar63._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar81._4_4_ =
                               (float)((uint)bVar54 * auVar66._4_4_ | (uint)!bVar54 * auVar63._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar81._8_4_ =
                               (float)((uint)bVar54 * auVar66._8_4_ | (uint)!bVar54 * auVar63._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar81._12_4_ =
                               (float)((uint)bVar54 * auVar66._12_4_ |
                                      (uint)!bVar54 * auVar63._12_4_);
                          auVar63 = vfmsub231ps_fma(auVar64,auVar81,auVar123);
                          auVar64 = vfnmsub231ps_fma(auVar63,auVar81,auVar124);
                          auVar106._0_4_ = auVar64._0_4_ * auVar64._0_4_;
                          auVar106._4_4_ = auVar64._4_4_ * auVar64._4_4_;
                          auVar106._8_4_ = auVar64._8_4_ * auVar64._8_4_;
                          auVar106._12_4_ = auVar64._12_4_ * auVar64._12_4_;
                          auVar63 = vfmadd213ps_fma(auVar126,auVar64,auVar61);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar64,auVar62);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar64,auVar91);
                          auVar63 = vfmadd213ps_avx512vl(auVar63,auVar64,auVar104);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar64,auVar86);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar106,auVar64);
                          auVar93._0_4_ = auVar63._0_4_ + 1.0;
                          auVar93._4_4_ = auVar63._4_4_ + 1.0;
                          auVar93._8_4_ = auVar63._8_4_ + 1.0;
                          auVar93._12_4_ = auVar63._12_4_ + 1.0;
                          auVar107._0_4_ = (int)auVar81._0_4_;
                          auVar107._4_4_ = (int)auVar81._4_4_;
                          auVar107._8_4_ = (int)auVar81._8_4_;
                          auVar107._12_4_ = (int)auVar81._12_4_;
                          auVar63 = vpslld_avx(auVar107,0x17);
                          auVar63 = vpaddd_avx512vl(auVar63,auVar57);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar93,auVar122);
                          auVar63 = vdivps_avx512vl(auVar122,auVar63);
                          in_ZMM21 = ZEXT1664(auVar63);
                          auVar58 = vxorps_avx512vl(auVar58,auVar59);
                          auVar58 = vminps_avx512vl(auVar58,auVar80);
                          auVar59 = vmaxps_avx(auVar58,auVar83);
                          auVar63 = vfmadd213ps_fma(auVar60,auVar59,auVar86);
                          auVar116._0_4_ = (int)auVar63._0_4_;
                          auVar116._4_4_ = (int)auVar63._4_4_;
                          auVar116._8_4_ = (int)auVar63._8_4_;
                          auVar116._12_4_ = (int)auVar63._12_4_;
                          auVar58 = vcvtdq2ps_avx(auVar116);
                          uVar41 = vcmpps_avx512vl(auVar63,auVar58,1);
                          auVar63 = vsubps_avx512vl(auVar58,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar82._0_4_ =
                               (float)((uint)bVar54 * auVar63._0_4_ | (uint)!bVar54 * auVar58._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar82._4_4_ =
                               (float)((uint)bVar54 * auVar63._4_4_ | (uint)!bVar54 * auVar58._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar82._8_4_ =
                               (float)((uint)bVar54 * auVar63._8_4_ | (uint)!bVar54 * auVar58._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar82._12_4_ =
                               (float)((uint)bVar54 * auVar63._12_4_ |
                                      (uint)!bVar54 * auVar58._12_4_);
                          auVar58 = vfmsub231ps_fma(auVar59,auVar82,auVar123);
                          auVar59 = vfnmsub231ps_fma(auVar58,auVar82,auVar124);
                          auVar108._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                          auVar108._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                          auVar108._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                          auVar108._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                          auVar58 = vfmadd213ps_fma(auVar126,auVar59,auVar61);
                          auVar58 = vfmadd213ps_fma(auVar58,auVar59,auVar62);
                          auVar58 = vfmadd213ps_fma(auVar58,auVar59,auVar91);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar59,auVar104);
                          auVar58 = vfmadd213ps_fma(auVar58,auVar59,auVar86);
                          auVar58 = vfmadd213ps_fma(auVar58,auVar108,auVar59);
                          auVar94._0_4_ = auVar58._0_4_ + 1.0;
                          auVar94._4_4_ = auVar58._4_4_ + 1.0;
                          auVar94._8_4_ = auVar58._8_4_ + 1.0;
                          auVar94._12_4_ = auVar58._12_4_ + 1.0;
                          auVar58._0_4_ = (int)auVar82._0_4_;
                          auVar58._4_4_ = (int)auVar82._4_4_;
                          auVar58._8_4_ = (int)auVar82._8_4_;
                          auVar58._12_4_ = (int)auVar82._12_4_;
                          auVar58 = vpslld_avx(auVar58,0x17);
                          auVar58 = vpaddd_avx512vl(auVar58,auVar57);
                          auVar58 = vfmadd213ps_fma(auVar58,auVar94,auVar122);
                          auVar58 = vdivps_avx512vl(auVar122,auVar58);
                          in_ZMM22 = ZEXT1664(auVar58);
                          break;
                        case 5:
                          auVar64 = vminps_avx512vl(auVar63,auVar80);
                          auVar66 = vmaxps_avx(auVar64,auVar83);
                          auVar98 = vfmadd213ps_fma(auVar60,auVar66,auVar86);
                          auVar111._0_4_ = (int)auVar98._0_4_;
                          auVar111._4_4_ = (int)auVar98._4_4_;
                          auVar111._8_4_ = (int)auVar98._8_4_;
                          auVar111._12_4_ = (int)auVar98._12_4_;
                          auVar64 = vcvtdq2ps_avx(auVar111);
                          uVar41 = vcmpps_avx512vl(auVar98,auVar64,1);
                          auVar65 = vsubps_avx512vl(auVar64,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar98._0_4_ =
                               (float)((uint)bVar54 * auVar65._0_4_ | (uint)!bVar54 * auVar64._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar98._4_4_ =
                               (float)((uint)bVar54 * auVar65._4_4_ | (uint)!bVar54 * auVar64._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar98._8_4_ =
                               (float)((uint)bVar54 * auVar65._8_4_ | (uint)!bVar54 * auVar64._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar98._12_4_ =
                               (float)((uint)bVar54 * auVar65._12_4_ |
                                      (uint)!bVar54 * auVar64._12_4_);
                          auVar64 = vfmsub231ps_fma(auVar66,auVar98,auVar123);
                          auVar66 = vfnmsub231ps_fma(auVar64,auVar98,auVar124);
                          auVar96._0_4_ = auVar66._0_4_ * auVar66._0_4_;
                          auVar96._4_4_ = auVar66._4_4_ * auVar66._4_4_;
                          auVar96._8_4_ = auVar66._8_4_ * auVar66._8_4_;
                          auVar96._12_4_ = auVar66._12_4_ * auVar66._12_4_;
                          auVar64 = vfmadd213ps_fma(auVar126,auVar66,auVar61);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar66,auVar62);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar66,auVar91);
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar66,auVar104);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar66,auVar86);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar96,auVar66);
                          auVar88._0_4_ = auVar64._0_4_ + 1.0;
                          auVar88._4_4_ = auVar64._4_4_ + 1.0;
                          auVar88._8_4_ = auVar64._8_4_ + 1.0;
                          auVar88._12_4_ = auVar64._12_4_ + 1.0;
                          auVar97._0_4_ = (int)auVar98._0_4_;
                          auVar97._4_4_ = (int)auVar98._4_4_;
                          auVar97._8_4_ = (int)auVar98._8_4_;
                          auVar97._12_4_ = (int)auVar98._12_4_;
                          auVar64 = vpslld_avx(auVar97,0x17);
                          auVar64 = vpaddd_avx512vl(auVar64,auVar57);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar88,auVar122);
                          uVar41 = vcmpps_avx512vl(auVar64,(undefined1  [16])0x0,2);
                          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x800000));
                          auVar64 = vmaxps_avx512vl(auVar64,auVar66);
                          auVar98 = vpsrld_avx(auVar64,0x17);
                          auVar67 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                          auVar66 = vpternlogd_avx512vl(auVar64,auVar133._0_16_,auVar67,0xec);
                          auVar64 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
                          auVar64 = vpaddd_avx512vl(auVar98,auVar64);
                          auVar64 = vcvtdq2ps_avx(auVar64);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                          uVar11 = vcmpps_avx512vl(auVar66,auVar98,1);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                          auVar98 = vaddps_avx512vl(auVar66,auVar98);
                          auVar65 = vsubps_avx512vl(auVar64,auVar122);
                          bVar54 = (bool)((byte)uVar11 & 1);
                          auVar76._0_4_ =
                               (uint)bVar54 * auVar65._0_4_ | (uint)!bVar54 * auVar64._0_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar76._4_4_ =
                               (uint)bVar54 * auVar65._4_4_ | (uint)!bVar54 * auVar64._4_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar76._8_4_ =
                               (uint)bVar54 * auVar65._8_4_ | (uint)!bVar54 * auVar64._8_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar76._12_4_ =
                               (uint)bVar54 * auVar65._12_4_ | (uint)!bVar54 * auVar64._12_4_;
                          auVar64 = vaddps_avx512vl(auVar98,auVar66);
                          bVar54 = (bool)((byte)uVar11 & 1);
                          auVar102._0_4_ =
                               (float)((uint)bVar54 * auVar64._0_4_ | (uint)!bVar54 * auVar98._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar102._4_4_ =
                               (float)((uint)bVar54 * auVar64._4_4_ | (uint)!bVar54 * auVar98._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar102._8_4_ =
                               (float)((uint)bVar54 * auVar64._8_4_ | (uint)!bVar54 * auVar98._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar102._12_4_ =
                               (float)((uint)bVar54 * auVar64._12_4_ |
                                      (uint)!bVar54 * auVar98._12_4_);
                          auVar89._0_4_ = auVar102._0_4_ * auVar102._0_4_;
                          auVar89._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                          auVar89._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                          auVar89._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                          auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                          auVar64 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
                          auVar64 = vfmadd213ps_avx512vl(auVar68,auVar102,auVar64);
                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar102,auVar69);
                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar102,auVar70);
                          auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar102,auVar71);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar102,auVar72);
                          auVar119._8_4_ = 0x3e4cceac;
                          auVar119._0_8_ = 0x3e4cceac3e4cceac;
                          auVar119._12_4_ = 0x3e4cceac;
                          auVar64 = vfmadd213ps_fma(auVar64,auVar102,auVar119);
                          auVar120._8_4_ = 0xbe7ffffc;
                          auVar120._0_8_ = 0xbe7ffffcbe7ffffc;
                          auVar120._12_4_ = 0xbe7ffffc;
                          auVar64 = vfmadd213ps_fma(auVar64,auVar102,auVar120);
                          auVar121._8_4_ = 0x3eaaaaaa;
                          auVar121._0_8_ = 0x3eaaaaaa3eaaaaaa;
                          auVar121._12_4_ = 0x3eaaaaaa;
                          auVar64 = vfmadd213ps_fma(auVar64,auVar102,auVar121);
                          auVar66 = vmulps_avx512vl(auVar89,auVar102);
                          auVar64 = vmulps_avx512vl(auVar66,auVar64);
                          auVar64 = vfmadd231ps_fma(auVar64,auVar76,auVar124);
                          auVar64 = vfmsub231ps_fma(auVar64,auVar86,auVar89);
                          auVar64 = vsubps_avx(auVar64,auVar102);
                          auVar64 = vfmsub231ps_fma(auVar64,auVar123,auVar76);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar73._0_4_ =
                               (uint)bVar54 * 0x7fffffff |
                               (uint)!bVar54 * (int)(auVar64._0_4_ * -2.0);
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar73._4_4_ =
                               (uint)bVar54 * 0x7fffffff |
                               (uint)!bVar54 * (int)(auVar64._4_4_ * -2.0);
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar73._8_4_ =
                               (uint)bVar54 * 0x7fffffff |
                               (uint)!bVar54 * (int)(auVar64._8_4_ * -2.0);
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar73._12_4_ =
                               (uint)bVar54 * 0x7fffffff |
                               (uint)!bVar54 * (int)(auVar64._12_4_ * -2.0);
                          auVar64 = vminps_avx(auVar73,auVar80);
                          auVar64 = vmaxps_avx(auVar83,auVar64);
                          auVar66 = vfmadd213ps_fma(auVar60,auVar64,auVar86);
                          auVar112._0_4_ = (int)auVar66._0_4_;
                          auVar112._4_4_ = (int)auVar66._4_4_;
                          auVar112._8_4_ = (int)auVar66._8_4_;
                          auVar112._12_4_ = (int)auVar66._12_4_;
                          auVar98 = vcvtdq2ps_avx512vl(auVar112);
                          uVar41 = vcmpps_avx512vl(auVar66,auVar98,1);
                          auVar66 = vsubps_avx512vl(auVar98,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar74._0_4_ =
                               (uint)bVar54 * auVar66._0_4_ | (uint)!bVar54 * auVar98._0_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar74._4_4_ =
                               (uint)bVar54 * auVar66._4_4_ | (uint)!bVar54 * auVar98._4_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar74._8_4_ =
                               (uint)bVar54 * auVar66._8_4_ | (uint)!bVar54 * auVar98._8_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar74._12_4_ =
                               (uint)bVar54 * auVar66._12_4_ | (uint)!bVar54 * auVar98._12_4_;
                          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar74,auVar123);
                          auVar66 = vfnmsub231ps_avx512vl(auVar64,auVar74,auVar124);
                          auVar99._0_4_ = auVar66._0_4_ * auVar66._0_4_;
                          auVar99._4_4_ = auVar66._4_4_ * auVar66._4_4_;
                          auVar99._8_4_ = auVar66._8_4_ * auVar66._8_4_;
                          auVar99._12_4_ = auVar66._12_4_ * auVar66._12_4_;
                          auVar64 = vfmadd213ps_fma(auVar126,auVar66,auVar61);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar66,auVar62);
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar66,auVar91);
                          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar66,auVar104);
                          auVar64 = vfmadd213ps_fma(auVar64,auVar66,auVar86);
                          auVar98 = vfmadd213ps_fma(auVar64,auVar99,auVar66);
                          auVar64 = vminps_avx512vl(auVar58,auVar80);
                          auVar66 = vmaxps_avx(auVar83,auVar64);
                          auVar65 = vfmadd213ps_fma(auVar60,auVar66,auVar86);
                          auVar113._0_4_ = (int)auVar65._0_4_;
                          auVar113._4_4_ = (int)auVar65._4_4_;
                          auVar113._8_4_ = (int)auVar65._8_4_;
                          auVar113._12_4_ = (int)auVar65._12_4_;
                          auVar64 = vcvtdq2ps_avx(auVar113);
                          uVar41 = vcmpps_avx512vl(auVar65,auVar64,1);
                          auVar65 = vsubps_avx512vl(auVar64,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar75._0_4_ =
                               (float)((uint)bVar54 * auVar65._0_4_ | (uint)!bVar54 * auVar64._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar75._4_4_ =
                               (float)((uint)bVar54 * auVar65._4_4_ | (uint)!bVar54 * auVar64._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar75._8_4_ =
                               (float)((uint)bVar54 * auVar65._8_4_ | (uint)!bVar54 * auVar64._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar75._12_4_ =
                               (float)((uint)bVar54 * auVar65._12_4_ |
                                      (uint)!bVar54 * auVar64._12_4_);
                          auVar64 = vfmsub231ps_fma(auVar66,auVar75,auVar123);
                          auVar64 = vfnmsub231ps_fma(auVar64,auVar75,auVar124);
                          auVar100._0_4_ = auVar64._0_4_ * auVar64._0_4_;
                          auVar100._4_4_ = auVar64._4_4_ * auVar64._4_4_;
                          auVar100._8_4_ = auVar64._8_4_ * auVar64._8_4_;
                          auVar100._12_4_ = auVar64._12_4_ * auVar64._12_4_;
                          auVar76 = vmovdqa64_avx512vl(auVar133._0_16_);
                          auVar66 = vfmadd213ps_avx512vl(auVar126,auVar64,auVar61);
                          auVar66 = vfmadd213ps_avx512vl(auVar66,auVar64,auVar62);
                          auVar66 = vfmadd213ps_avx512vl(auVar66,auVar64,auVar91);
                          auVar66 = vfmadd213ps_avx512vl(auVar66,auVar64,auVar104);
                          auVar66 = vfmadd213ps_avx512vl(auVar66,auVar64,auVar86);
                          auVar64 = vfmadd213ps_avx512vl(auVar66,auVar100,auVar64);
                          auVar64 = vaddps_avx512vl(auVar64,auVar122);
                          auVar101._0_4_ = (int)auVar75._0_4_;
                          auVar101._4_4_ = (int)auVar75._4_4_;
                          auVar101._8_4_ = (int)auVar75._8_4_;
                          auVar101._12_4_ = (int)auVar75._12_4_;
                          auVar66 = vpslld_avx(auVar101,0x17);
                          auVar66 = vpaddd_avx512vl(auVar66,auVar57);
                          auVar64 = vfmadd213ps_fma(auVar66,auVar64,auVar122);
                          uVar41 = vcmpps_avx512vl(auVar64,(undefined1  [16])0x0,2);
                          auVar66._8_4_ = 0x800000;
                          auVar66._0_8_ = 0x80000000800000;
                          auVar66._12_4_ = 0x800000;
                          auVar64 = vmaxps_avx512vl(auVar64,auVar66);
                          auVar102 = vpsrld_avx(auVar64,0x17);
                          auVar66 = vpternlogd_avx512vl(auVar64,auVar76,auVar67,0xec);
                          auVar132 = ZEXT1664(auVar126);
                          auVar84 = ZEXT1664(auVar59);
                          auVar64._8_4_ = 0x3f3504f3;
                          auVar64._0_8_ = 0x3f3504f33f3504f3;
                          auVar64._12_4_ = 0x3f3504f3;
                          uVar11 = vcmpps_avx512vl(auVar66,auVar64,1);
                          auVar65._8_4_ = 0xbf800000;
                          auVar65._0_8_ = 0xbf800000bf800000;
                          auVar65._12_4_ = 0xbf800000;
                          auVar59 = vaddps_avx512vl(auVar66,auVar65);
                          auVar64 = vaddps_avx512vl(auVar59,auVar66);
                          bVar54 = (bool)((byte)uVar11 & 1);
                          auVar77._0_4_ =
                               (float)((uint)bVar54 * auVar64._0_4_ | (uint)!bVar54 * auVar59._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar77._4_4_ =
                               (float)((uint)bVar54 * auVar64._4_4_ | (uint)!bVar54 * auVar59._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar77._8_4_ =
                               (float)((uint)bVar54 * auVar64._8_4_ | (uint)!bVar54 * auVar59._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar77._12_4_ =
                               (float)((uint)bVar54 * auVar64._12_4_ |
                                      (uint)!bVar54 * auVar59._12_4_);
                          auVar90._0_4_ = auVar77._0_4_ * auVar77._0_4_;
                          auVar90._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                          auVar90._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                          auVar90._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                          auVar67._8_4_ = 0xbdebd1b8;
                          auVar67._0_8_ = 0xbdebd1b8bdebd1b8;
                          auVar67._12_4_ = 0xbdebd1b8;
                          auVar59 = vfmadd213ps_avx512vl(auVar68,auVar77,auVar67);
                          auVar117 = ZEXT1664(auVar83);
                          auVar125 = ZEXT1664(auVar61);
                          auVar118 = ZEXT1664(auVar60);
                          auVar128 = ZEXT1664(auVar62);
                          auVar129 = ZEXT1664(auVar91);
                          auVar130 = ZEXT1664(auVar104);
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar69);
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar70);
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar71);
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar72);
                          auVar68._8_4_ = 0x3e4cceac;
                          auVar68._0_8_ = 0x3e4cceac3e4cceac;
                          auVar68._12_4_ = 0x3e4cceac;
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar68);
                          auVar69._8_4_ = 0xbe7ffffc;
                          auVar69._0_8_ = 0xbe7ffffcbe7ffffc;
                          auVar69._12_4_ = 0xbe7ffffc;
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar69);
                          auVar70._8_4_ = 0x3eaaaaaa;
                          auVar70._0_8_ = 0x3eaaaaaa3eaaaaaa;
                          auVar70._12_4_ = 0x3eaaaaaa;
                          auVar59 = vfmadd213ps_avx512vl(auVar59,auVar77,auVar70);
                          auVar64 = vmulps_avx512vl(auVar90,auVar77);
                          auVar64 = vmulps_avx512vl(auVar64,auVar59);
                          auVar71._8_4_ = 0xffffff82;
                          auVar71._0_8_ = 0xffffff82ffffff82;
                          auVar71._12_4_ = 0xffffff82;
                          auVar59 = vpaddd_avx512vl(auVar102,auVar71);
                          auVar59 = vcvtdq2ps_avx(auVar59);
                          auVar66 = vsubps_avx512vl(auVar59,auVar122);
                          bVar54 = (bool)((byte)uVar11 & 1);
                          auVar78._0_4_ =
                               (uint)bVar54 * auVar66._0_4_ | (uint)!bVar54 * auVar59._0_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 1) & 1);
                          auVar78._4_4_ =
                               (uint)bVar54 * auVar66._4_4_ | (uint)!bVar54 * auVar59._4_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 2) & 1);
                          auVar78._8_4_ =
                               (uint)bVar54 * auVar66._8_4_ | (uint)!bVar54 * auVar59._8_4_;
                          bVar54 = (bool)((byte)(uVar11 >> 3) & 1);
                          auVar78._12_4_ =
                               (uint)bVar54 * auVar66._12_4_ | (uint)!bVar54 * auVar59._12_4_;
                          auVar59 = vfmadd231ps_avx512vl(auVar64,auVar78,auVar124);
                          auVar59 = vfmsub231ps_avx512vl(auVar59,auVar86,auVar90);
                          auVar59 = vsubps_avx512vl(auVar59,auVar77);
                          auVar59 = vfmsub231ps_fma(auVar59,auVar123,auVar78);
                          auVar72._8_4_ = 0xc0000000;
                          auVar72._0_8_ = 0xc0000000c0000000;
                          auVar72._12_4_ = 0xc0000000;
                          auVar59 = vmulps_avx512vl(auVar59,auVar72);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar79._0_4_ = (uint)bVar54 * 0x7fffffff | (uint)!bVar54 * auVar59._0_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar79._4_4_ = (uint)bVar54 * 0x7fffffff | (uint)!bVar54 * auVar59._4_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar79._8_4_ = (uint)bVar54 * 0x7fffffff | (uint)!bVar54 * auVar59._8_4_;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar79._12_4_ =
                               (uint)bVar54 * 0x7fffffff | (uint)!bVar54 * auVar59._12_4_;
                          auVar131 = ZEXT1664(auVar80);
                          auVar59 = vminps_avx512vl(auVar79,auVar80);
                          auVar83 = vmaxps_avx(auVar59,auVar83);
                          auVar60 = vfmadd213ps_fma(auVar60,auVar83,auVar86);
                          auVar114._0_4_ = (int)auVar60._0_4_;
                          auVar114._4_4_ = (int)auVar60._4_4_;
                          auVar114._8_4_ = (int)auVar60._8_4_;
                          auVar114._12_4_ = (int)auVar60._12_4_;
                          auVar59 = vcvtdq2ps_avx(auVar114);
                          uVar41 = vcmpps_avx512vl(auVar60,auVar59,1);
                          auVar60 = vsubps_avx512vl(auVar59,auVar122);
                          bVar54 = (bool)((byte)uVar41 & 1);
                          auVar80._0_4_ =
                               (float)((uint)bVar54 * auVar60._0_4_ | (uint)!bVar54 * auVar59._0_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 1) & 1);
                          auVar80._4_4_ =
                               (float)((uint)bVar54 * auVar60._4_4_ | (uint)!bVar54 * auVar59._4_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 2) & 1);
                          auVar80._8_4_ =
                               (float)((uint)bVar54 * auVar60._8_4_ | (uint)!bVar54 * auVar59._8_4_)
                          ;
                          bVar54 = (bool)((byte)(uVar41 >> 3) & 1);
                          auVar80._12_4_ =
                               (float)((uint)bVar54 * auVar60._12_4_ |
                                      (uint)!bVar54 * auVar59._12_4_);
                          auVar59 = vfmsub231ps_fma(auVar83,auVar80,auVar123);
                          auVar59 = vfnmsub231ps_fma(auVar59,auVar80,auVar124);
                          auVar103._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                          auVar103._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                          auVar103._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                          auVar103._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                          auVar83 = vfmadd213ps_avx512vl(auVar126,auVar59,auVar61);
                          auVar83 = vfmadd213ps_avx512vl(auVar83,auVar59,auVar62);
                          auVar83 = vfmadd213ps_avx512vl(auVar83,auVar59,auVar91);
                          auVar83 = vfmadd213ps_avx512vl(auVar83,auVar59,auVar104);
                          auVar83 = vfmadd213ps_avx512vl(auVar83,auVar59,auVar86);
                          auVar83 = vfmadd213ps_avx512vl(auVar83,auVar103,auVar59);
                          auVar91._0_4_ = auVar98._0_4_ + 1.0;
                          auVar91._4_4_ = auVar98._4_4_ + 1.0;
                          auVar91._8_4_ = auVar98._8_4_ + 1.0;
                          auVar91._12_4_ = auVar98._12_4_ + 1.0;
                          auVar59 = vcvttps2dq_avx512vl(auVar74);
                          auVar59 = vpslld_avx(auVar59,0x17);
                          auVar59 = vpaddd_avx512vl(auVar59,auVar57);
                          auVar59 = vfmadd213ps_fma(auVar59,auVar91,auVar122);
                          auVar126._8_4_ = 0x40000000;
                          auVar126._0_8_ = 0x4000000040000000;
                          auVar126._12_4_ = 0x40000000;
                          auVar59 = vdivps_avx(auVar126,auVar59);
                          auVar59 = vfmsub231ps_avx512vl(auVar63,auVar63,auVar59);
                          in_ZMM21 = ZEXT1664(auVar59);
                          auVar59 = vaddps_avx512vl(auVar83,auVar122);
                          auVar63 = vmovdqa64_avx512vl(auVar76);
                          auVar133 = ZEXT1664(auVar63);
                          auVar104._0_4_ = (int)auVar80._0_4_;
                          auVar104._4_4_ = (int)auVar80._4_4_;
                          auVar104._8_4_ = (int)auVar80._8_4_;
                          auVar104._12_4_ = (int)auVar80._12_4_;
                          auVar63 = vpslld_avx(auVar104,0x17);
                          auVar63 = vpaddd_avx512vl(auVar63,auVar57);
                          auVar59 = vfmadd213ps_fma(auVar63,auVar59,auVar122);
                          auVar59 = vdivps_avx(auVar126,auVar59);
                          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar58,auVar59);
                          in_ZMM22 = ZEXT1664(auVar58);
                          break;
                        case 6:
                          puVar37 = (undefined4 *)
                                    (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar3 = *puVar37;
                          auVar60._4_4_ = uVar3;
                          auVar60._0_4_ = uVar3;
                          auVar60._8_4_ = uVar3;
                          auVar60._12_4_ = uVar3;
                          uVar3 = puVar37[1];
                          auVar61._4_4_ = uVar3;
                          auVar61._0_4_ = uVar3;
                          auVar61._8_4_ = uVar3;
                          auVar61._12_4_ = uVar3;
                          auVar59 = vfmadd213ps_fma(auVar63,auVar60,auVar61);
                          auVar59 = vmaxps_avx(auVar59,(undefined1  [16])0x0);
                          auVar59 = vminps_avx(auVar122,auVar59);
                          auVar59 = vmulps_avx512vl(auVar59,auVar63);
                          in_ZMM21 = ZEXT1664(auVar59);
                          auVar59 = vfmadd213ps_avx512vl(auVar60,auVar58,auVar61);
                          auVar59 = vmaxps_avx(auVar59,(undefined1  [16])0x0);
                          auVar59 = vminps_avx(auVar122,auVar59);
                          auVar58 = vmulps_avx512vl(auVar59,auVar58);
                          in_ZMM22 = ZEXT1664(auVar58);
                        }
                        if (iVar36 < 0x65) {
                          *pauVar40 = in_ZMM21._0_16_;
                          pauVar40[1] = in_ZMM22._0_16_;
                          pauVar40 = pauVar40 + 2;
                        }
                        else {
                          pvVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                          auVar58 = vmulps_avx512vl(in_ZMM21._0_16_,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar6 + local_2e0 * 0x20));
                          auVar59 = vmulps_avx512vl(in_ZMM22._0_16_,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar6 + local_2e0 * 0x20 + 0x10));
                          auVar63 = vmovdqa64_avx512vl(auVar133._0_16_);
                          auVar63 = vpternlogd_avx512vl(auVar63,auVar58,auVar84._0_16_,0xf8);
                          auVar83 = vmovdqa64_avx512vl(auVar133._0_16_);
                          auVar83 = vpternlogd_avx512vl(auVar83,auVar59,auVar84._0_16_,0xf8);
                          auVar95._0_4_ = (int)(auVar58._0_4_ + auVar63._0_4_);
                          auVar95._4_4_ = (int)(auVar58._4_4_ + auVar63._4_4_);
                          auVar95._8_4_ = (int)(auVar58._8_4_ + auVar63._8_4_);
                          auVar95._12_4_ = (int)(auVar58._12_4_ + auVar63._12_4_);
                          auVar110._0_4_ = (int)(auVar83._0_4_ + auVar59._0_4_);
                          auVar110._4_4_ = (int)(auVar83._4_4_ + auVar59._4_4_);
                          auVar110._8_4_ = (int)(auVar83._8_4_ + auVar59._8_4_);
                          auVar110._12_4_ = (int)(auVar83._12_4_ + auVar59._12_4_);
                          auVar58 = vpackssdw_avx(auVar95,auVar110);
                          auVar58 = vpminsw_avx512vl(auVar58,auVar55);
                          auVar58 = vpmaxsw_avx512vl(auVar58,auVar56);
                          auVar58 = vpacksswb_avx(auVar58,auVar58);
                          *(long *)*pauVar39 = auVar58._0_8_;
                          pauVar39 = (undefined1 (*) [16])((long)*pauVar39 + 8);
                        }
                        bVar54 = iVar43 != iVar31;
                        iVar43 = iVar43 + 1;
                      } while (bVar54);
                    }
                    uVar41 = (ulong)(iVar42 + 1);
                  } while (iVar42 != (int)local_220);
                }
                local_2e0 = local_2e0 + 1;
                iVar50 = iVar50 + (int)uVar53 * 8;
              } while (local_2e0 != lVar33);
            }
            if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
              uVar53 = local_2b8._16_8_ - local_2b8._0_8_;
              pfVar48 = (pointer)local_2b8._0_8_;
LAB_003e6362:
              local_2fc = 0;
              operator_delete(pfVar48,uVar53);
            }
          }
        }
      }
    }
    else {
      uVar30 = (this->super_ConvolutionDepthWise).num_output;
      iVar31 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar53 = 1;
      if (opt->use_packing_layout == true) {
        if (iVar31 < 0x65) {
          uVar53 = (ulong)((uint)((uVar30 & 3) == 0) * 3 + 1);
        }
        else {
          uVar53 = 1;
          if ((uVar30 & 7) == 0) {
            uVar53 = 8;
          }
        }
      }
      local_2fc = -100;
      uVar13 = (uint)uVar53;
      uVar41 = (ulong)(uVar13 * 4);
      if (100 < iVar31) {
        uVar41 = uVar53;
      }
      Mat::create(top_blob,iVar42,iVar50,(int)uVar30 / (int)uVar13,uVar41,uVar13,opt->blob_allocator
                 );
      OVar23 = _local_2b8;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar36 = (this->super_ConvolutionDepthWise).group;
        uVar47 = (int)uVar47 / iVar36;
        uVar30 = (this->super_ConvolutionDepthWise).num_output / iVar36;
        local_270 = CONCAT44(local_270._4_4_,uVar30);
        iVar36 = 1;
        _elempack = 1;
        if (opt->use_packing_layout == true) {
          iVar36 = 1;
          if ((uVar47 & 7) == 0) {
            iVar36 = 8;
          }
          if (iVar31 < 0x65) {
            _elempack = (uint)((uVar30 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar30 & 7) == 0) {
              _elempack = 8;
            }
          }
        }
        piVar4 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
        local_2b8._12_4_ = local_218.refcount._4_4_;
        local_2b8._8_4_ = local_218.refcount._0_4_;
        local_2b8._0_8_ = local_218.data;
        local_2b8._16_8_ = local_218.elemsize;
        auStack_29c = OVar23._28_36_;
        iStack_2a0 = local_218.elempack;
        pAStack_298 = local_218.allocator;
        uStack_290._4_1_ = (bool)(undefined1)local_218.w;
        uStack_290._5_1_ = (bool)local_218.w._1_1_;
        uStack_290._6_1_ = (bool)local_218.w._2_1_;
        uStack_290._7_1_ = (bool)local_218.w._3_1_;
        uStack_290._0_4_ = local_218.dims;
        uStack_288._4_1_ = (bool)(undefined1)local_218.d;
        uStack_288._5_1_ = (bool)local_218.d._1_1_;
        uStack_288._6_1_ = (bool)local_218.d._2_1_;
        uStack_288._7_1_ = (bool)local_218.d._3_1_;
        uStack_288._0_4_ = local_218.h;
        auStack_29c._32_4_ = OVar23._60_4_;
        iStack_280._0_1_ = (bool)(undefined1)local_218.c;
        iStack_280._1_1_ = (bool)local_218.c._1_1_;
        iStack_280._2_1_ = (bool)local_218.c._2_1_;
        iStack_280._3_1_ = (bool)local_218.c._3_1_;
        local_278 = local_218.cstep;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        if (iVar36 < iVar43) {
          auVar84 = vmovdqu64_avx512f((undefined1  [64])*opt);
          auVar84 = vmovdqu64_avx512f(auVar84);
          stack0xfffffffffffffda8 = auVar84._16_48_;
          local_268._0_8_ = auVar84._0_8_;
          local_268._8_8_ = opt->workspace_allocator;
          convert_packing(&local_218,(Mat *)local_2b8,iVar36,(Option *)local_268);
          if (((pointer)local_2b8._0_8_ != (pointer)0x0) && ((long)iStack_280 * local_278 != 0))
          goto LAB_003e67f1;
          local_2fc = -100;
        }
        else {
LAB_003e67f1:
          auVar25 = auStack_24c;
          piVar4 = top_blob->refcount;
          uVar18 = top_blob->data;
          uVar19 = top_blob->refcount;
          uVar20 = top_blob->elemsize;
          uVar21 = top_blob->elempack;
          iStack_250 = uVar21;
          local_268._16_8_ = uVar20;
          local_268._8_8_ = uVar19;
          local_268._0_8_ = uVar18;
          pAStack_248 = top_blob->allocator;
          uVar14 = top_blob->dims;
          uVar15 = top_blob->w;
          uStack_240._4_4_ = uVar15;
          uStack_240._0_4_ = uVar14;
          uVar16 = top_blob->h;
          uVar17 = top_blob->d;
          uStack_238._4_4_ = uVar17;
          uStack_238._0_4_ = uVar16;
          auStack_24c._32_4_ = auVar25._32_4_;
          iStack_230 = top_blob->c;
          local_228 = top_blob->cstep;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          if (_elempack < uVar13) {
            local_2c0 = (byte)uVar53;
            Mat::create((Mat *)local_268,iVar42,iVar50,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((byte)((ushort)uVar41 / (ushort)local_2c0) * _elempack),_elempack,
                        opt->workspace_allocator);
            local_2fc = -100;
            if (((void *)local_268._0_8_ != (void *)0x0) && ((long)iStack_230 * local_228 != 0))
            goto LAB_003e68c5;
          }
          else {
LAB_003e68c5:
            if (0 < (this->super_ConvolutionDepthWise).group) {
              iVar31 = (int)local_270 / (int)_elempack;
              iVar50 = 0;
              iVar42 = 0;
              lVar33 = 0;
              do {
                OVar24 = _local_268;
                OVar23 = _local_2b8;
                local_1c0 = (pointer)((long)(iVar50 / iVar36) * local_278 * local_2b8._16_8_ +
                                     local_2b8._0_8_);
                local_1b8 = (int *)0x0;
                local_1b0 = (Allocator *)local_2b8._16_8_;
                local_1a8 = iStack_2a0;
                local_1a0 = pAStack_298;
                uVar22 = uStack_290;
                uVar12 = uStack_288;
                local_180 = ((long)uStack_288._4_4_ * local_2b8._16_8_ *
                             (long)(int)uStack_288 * (long)uStack_290._4_4_ + 0xfU &
                            0xfffffffffffffff0) / (ulong)local_2b8._16_8_;
                uStack_290._0_4_ = (int)uVar22;
                uStack_290._4_4_ = SUB84(uVar22,4);
                local_198 = (int)uStack_290;
                iStack_194 = uStack_290._4_4_;
                uStack_288._0_4_ = (int)uVar12;
                uStack_288._4_4_ = SUB84(uVar12,4);
                iStack_190 = (int)uStack_288;
                iStack_18c = uStack_288._4_4_;
                local_120 = (void *)((long)(iVar42 / (int)_elempack) * local_228 * local_268._16_8_
                                    + local_268._0_8_);
                local_118 = (int *)0x0;
                local_110 = (Allocator *)local_268._16_8_;
                local_108 = iStack_250;
                local_100 = pAStack_248;
                uVar22 = uStack_240;
                uVar12 = uStack_238;
                local_e0 = ((long)uStack_238._4_4_ * local_268._16_8_ *
                            (long)(int)uStack_238 * (long)uStack_240._4_4_ + 0xfU &
                           0xfffffffffffffff0) / (ulong)local_268._16_8_;
                uStack_240._0_4_ = (int)uVar22;
                uStack_240._4_4_ = SUB84(uVar22,4);
                local_f8 = (int)uStack_240;
                iStack_f4 = uStack_240._4_4_;
                uStack_238._0_4_ = (int)uVar12;
                uStack_238._4_4_ = SUB84(uVar12,4);
                iStack_f0 = (int)uStack_238;
                iStack_ec = uStack_238._4_4_;
                pLVar10 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar33];
                auVar84 = vmovdqu64_avx512f((undefined1  [64])*opt);
                auVar84 = vmovdqu64_avx512f(auVar84);
                auStack_68 = auVar84._16_48_;
                local_78._0_8_ = auVar84._0_8_;
                local_78._8_8_ = pAStack_248;
                _local_2b8 = OVar23;
                _local_268 = OVar24;
                local_188 = (int)uVar47 / iVar36;
                local_e8 = iVar31;
                local_2fc = (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1c0,&local_120,local_78);
                if (local_118 != (int *)0x0) {
                  LOCK();
                  *local_118 = *local_118 + -1;
                  UNLOCK();
                  if (*local_118 == 0) {
                    if (local_100 == (Allocator *)0x0) {
                      if (local_120 != (void *)0x0) {
                        free(local_120);
                      }
                    }
                    else {
                      (*local_100->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_1b8 != (int *)0x0) {
                  LOCK();
                  *local_1b8 = *local_1b8 + -1;
                  UNLOCK();
                  if (*local_1b8 == 0) {
                    if (local_1a0 == (Allocator *)0x0) {
                      if (local_1c0 != (pointer)0x0) {
                        free(local_1c0);
                      }
                    }
                    else {
                      (*local_1a0->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_2fc != 0) goto LAB_003e7440;
                lVar33 = lVar33 + 1;
                iVar42 = iVar42 + (int)local_270;
                iVar50 = iVar50 + uVar47;
              } while (lVar33 < (this->super_ConvolutionDepthWise).group);
            }
            if (_elempack < uVar13) {
              convert_packing((Mat *)local_268,top_blob,uVar13,opt);
              local_2fc = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              goto LAB_003e7440;
            }
            else if ((Mat *)local_268 != top_blob) {
              if ((Allocator *)local_268._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_268._8_8_ = *(int *)(_func_int ***)local_268._8_8_ + 1;
                UNLOCK();
              }
              piVar4 = top_blob->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              OVar23 = _local_268;
              top_blob->data = (void *)local_268._0_8_;
              top_blob->refcount = (int *)local_268._8_8_;
              top_blob->elemsize = local_268._16_8_;
              top_blob->elempack = iStack_250;
              top_blob->allocator = pAStack_248;
              top_blob->dims = (int)uStack_240;
              top_blob->w = uStack_240._4_4_;
              top_blob->h = (int)uStack_238;
              top_blob->d = uStack_238._4_4_;
              iStack_230 = OVar23._56_4_;
              top_blob->c = iStack_230;
              top_blob->cstep = local_228;
              _local_268 = OVar23;
            }
            local_2fc = 0;
          }
LAB_003e7440:
          if ((Allocator *)local_268._8_8_ != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_268._8_8_ = *(int *)(_func_int ***)local_268._8_8_ + -1;
            UNLOCK();
            if (*(int *)(_func_int ***)local_268._8_8_ == 0) {
              if (pAStack_248 == (Allocator *)0x0) {
                if ((void *)local_268._0_8_ != (void *)0x0) {
                  free((void *)local_268._0_8_);
                }
              }
              else {
                (*pAStack_248->_vptr_Allocator[3])();
              }
            }
          }
        }
        if ((Allocator *)local_2b8._8_8_ != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_2b8._8_8_ = *(int *)(_func_int ***)local_2b8._8_8_ + -1;
          UNLOCK();
          if (*(int *)(_func_int ***)local_2b8._8_8_ == 0) {
            if (pAStack_298 == (Allocator *)0x0) {
              if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
                free((void *)local_2b8._0_8_);
              }
            }
            else {
              (*pAStack_298->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
LAB_003e6371:
  piVar4 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_218.data != (undefined4 *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003e63ed:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_2fc;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}